

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score_test.cc
# Opt level: O0

void __thiscall xLearn::FFMScore_Test_calc_score_Test::TestBody(FFMScore_Test_calc_score_Test *this)

{
  uint uVar1;
  bool bVar2;
  index_t iVar3;
  index_t iVar4;
  reference pvVar5;
  real_t *prVar6;
  char *message;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  AssertionResult gtest_ar;
  real_t val;
  size_t i_2;
  FFMScore score;
  index_t s;
  index_t d;
  index_t f;
  index_t j;
  index_t k_aligned;
  real_t *v;
  index_t i_1;
  index_t num_w;
  real_t *w;
  Model model;
  index_t i;
  SparseRow row;
  HyperParam param;
  index_t k;
  HyperParam *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbf0;
  real_t in_stack_fffffffffffffbf4;
  real_t *in_stack_fffffffffffffbf8;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffc00;
  double local_3f8;
  AssertHelper local_3a0;
  Message local_398;
  AssertionResult local_390;
  real_t local_37c;
  ulong local_378;
  HyperParam *in_stack_fffffffffffffc90;
  real_t in_stack_fffffffffffffcc4;
  Model *in_stack_fffffffffffffcc8;
  SparseRow *in_stack_fffffffffffffcd0;
  FFMScore *in_stack_fffffffffffffcd8;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  real_t *local_2f8;
  uint local_2f0;
  Model local_2e0;
  uint local_250;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> local_248 [2];
  string local_218 [32];
  string local_1f8 [108];
  undefined4 local_18c;
  undefined4 local_188;
  uint local_168;
  uint local_160;
  undefined4 local_15c;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  uint local_c;
  
  for (local_c = 1; local_c < 100; local_c = local_c + 1) {
    HyperParam::HyperParam(in_stack_fffffffffffffc90);
    local_18c = 0x3dcccccd;
    local_188 = 0;
    std::__cxx11::string::operator=(local_1f8,"squared");
    std::__cxx11::string::operator=(local_218,"ffm");
    auVar8._8_56_ = extraout_var;
    auVar8._0_8_ = extraout_XMM1_Qa;
    local_168 = 3;
    local_160 = local_c;
    local_15c = 3;
    std::allocator<xLearn::Node>::allocator((allocator<xLearn::Node> *)0x13981c);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
              (in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    std::allocator<xLearn::Node>::~allocator((allocator<xLearn::Node> *)0x139845);
    for (local_250 = 0; uVar1 = local_250, local_250 < local_168; local_250 = local_250 + 1) {
      pvVar5 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[]
                         (local_248,(ulong)local_250);
      pvVar5->feat_id = uVar1;
      pvVar5 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[]
                         (local_248,(ulong)local_250);
      uVar1 = local_250;
      pvVar5->feat_val = 2.0;
      pvVar5 = std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[]
                         (local_248,(ulong)local_250);
      pvVar5->field_id = uVar1;
    }
    Model::Model((Model *)in_stack_fffffffffffffbe0);
    Model::Initialize((Model *)model.param_best_v_,(string *)model.param_best_w_,
                      (string *)model.param_b_,model.param_v_._4_4_,(index_t)model.param_v_,
                      model.param_w_._4_4_,(index_t)model.scale_,model.param_w_._0_4_);
    prVar6 = Model::GetParameter_w(&local_2e0);
    iVar3 = Model::GetNumParameter_w(&local_2e0);
    for (local_2f0 = 0; local_2f0 < iVar3; local_2f0 = local_2f0 + 1) {
      prVar6[local_2f0] = 1.0;
    }
    local_2f8 = Model::GetParameter_v(&local_2e0);
    iVar3 = Model::get_aligned_k((Model *)0x139a6a);
    for (local_300 = 0; iVar4 = Model::GetNumFeature(&local_2e0), local_300 < iVar4;
        local_300 = local_300 + 1) {
      for (local_304 = 0; iVar4 = Model::GetNumField(&local_2e0), local_304 < iVar4;
          local_304 = local_304 + 1) {
        local_308 = 0;
        while (local_308 < iVar3) {
          for (local_30c = 0; local_30c < 4; local_30c = local_30c + 1) {
            iVar4 = Model::GetNumK(&local_2e0);
            in_stack_fffffffffffffc00 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0;
            local_3f8 = 1.0;
            if (iVar4 <= local_308) {
              local_3f8 = 0.0;
            }
            auVar8 = ZEXT864((ulong)local_3f8);
            *local_2f8 = (float)local_3f8;
            local_2f8[4] = 1.0;
            local_2f8 = local_2f8 + 1;
            local_308 = local_308 + 1;
          }
          local_2f8 = local_2f8 + 4;
        }
      }
    }
    in_stack_fffffffffffffbf8 = Model::GetParameter_b(&local_2e0);
    *in_stack_fffffffffffffbf8 = 0.0;
    FFMScore::FFMScore((FFMScore *)in_stack_fffffffffffffbe0);
    for (local_378 = 0; auVar7 = auVar8._0_16_, local_378 < 10; local_378 = local_378 + 1) {
      in_stack_fffffffffffffbf4 =
           FFMScore::CalcScore(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                               in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4);
      auVar7 = vcvtusi2ss_avx512f(auVar7,local_c * 0xc + 6);
      auVar8 = ZEXT1664(auVar7);
      local_37c = in_stack_fffffffffffffbf4;
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffff98);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_390);
      in_stack_fffffffffffffbf0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffbf0);
      if (!bVar2) {
        testing::Message::Message(&local_398);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x139d58);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/ffm_score_test.cc"
                   ,0x4f,message);
        testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
        testing::internal::AssertHelper::~AssertHelper(&local_3a0);
        testing::Message::~Message((Message *)0x139db5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x139e0a);
    }
    FFMScore::~FFMScore((FFMScore *)0x139e3f);
    Model::~Model((Model *)in_stack_fffffffffffffbe0);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::~vector
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    HyperParam::~HyperParam(in_stack_fffffffffffffbe0);
  }
  return;
}

Assistant:

TEST(FFMScore_Test, calc_score) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "ffm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature);
    for (index_t i = 0; i < param.num_feature; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
      row[i].field_id = i;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for (index_t f = 0; f < model.GetNumField(); ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, v++, d++) {
            v[0] = (d < model.GetNumK()) ? 1.0 : 0.0;
            v[kAlign] = 1.0;
          }
          v += kAlign;
        }
      }
    }
    model.GetParameter_b()[0] = 0.0;
    FFMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      // 6 + 24*4*3 = 294
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}